

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

int Abc_AigCountNext(Abc_Aig_t *pMan)

{
  uint local_24;
  uint local_20;
  int CounterTotal;
  int Counter;
  int i;
  Abc_Obj_t *pAnd;
  Abc_Aig_t *pMan_local;
  
  local_20 = 0;
  local_24 = 0;
  for (CounterTotal = 0; CounterTotal < pMan->nBins; CounterTotal = CounterTotal + 1) {
    for (_Counter = pMan->pBins[CounterTotal]; _Counter != (Abc_Obj_t *)0x0;
        _Counter = _Counter->pNext) {
      local_20 = (_Counter->pNext != (Abc_Obj_t *)0x0) + local_20;
      local_24 = local_24 + 1;
    }
  }
  printf("Counter = %d.  Nodes = %d.  Ave = %6.2f\n",
         ((double)(int)local_24 * 1.0) / (double)pMan->nBins,(ulong)local_20,(ulong)local_24);
  return local_20;
}

Assistant:

int Abc_AigCountNext( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pAnd;
    int i, Counter = 0, CounterTotal = 0;
    // count how many nodes have pNext set
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pAnd )
        {
            Counter += (pAnd->pNext != NULL);
            CounterTotal++;
        }
    printf( "Counter = %d.  Nodes = %d.  Ave = %6.2f\n", Counter, CounterTotal, 1.0 * CounterTotal/pMan->nBins );
    return Counter;
}